

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkk.cpp
# Opt level: O0

void __thiscall HEkk::initialisePartitionedRowwiseMatrix(HEkk *this)

{
  HighsSimplexAnalysis *in_RDI;
  int8_t *in_stack_000000d0;
  HighsSparseMatrix *in_stack_000000d8;
  HighsSparseMatrix *in_stack_000000e0;
  undefined8 in_stack_ffffffffffffffe8;
  bool **ppbVar1;
  
  if ((in_RDI[1].before_ftran_upper_hyper_density.num_zero_ & 0x100) == 0) {
    HighsSimplexAnalysis::simplexTimerStart
              (in_RDI,(HighsInt)((ulong)in_stack_ffffffffffffffe8 >> 0x20),
               (HighsInt)in_stack_ffffffffffffffe8);
    ppbVar1 = &in_RDI[1].log_options.output_flag;
    std::vector<signed_char,_std::allocator<signed_char>_>::data
              ((vector<signed_char,_std::allocator<signed_char>_> *)0x76e1aa);
    HighsSparseMatrix::createRowwisePartitioned
              (in_stack_000000e0,in_stack_000000d8,in_stack_000000d0);
    HighsSimplexAnalysis::simplexTimerStop
              (in_RDI,(HighsInt)((ulong)ppbVar1 >> 0x20),(HighsInt)ppbVar1);
    *(undefined1 *)((long)&in_RDI[1].before_ftran_upper_hyper_density.num_zero_ + 1) = 1;
  }
  return;
}

Assistant:

void HEkk::initialisePartitionedRowwiseMatrix() {
  if (status_.has_ar_matrix) return;
  analysis_.simplexTimerStart(matrixSetupClock);
  ar_matrix_.createRowwisePartitioned(lp_.a_matrix_,
                                      basis_.nonbasicFlag_.data());
  assert(ar_matrix_.debugPartitionOk(basis_.nonbasicFlag_.data()));
  analysis_.simplexTimerStop(matrixSetupClock);
  status_.has_ar_matrix = true;
}